

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O3

MP<136UL,_GF2::MOGrevlex<136UL>_> * __thiscall
GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>::SPoly
          (MP<136UL,_GF2::MOGrevlex<136UL>_> *this,MP<136UL,_GF2::MOGrevlex<136UL>_> *poly1,
          MP<136UL,_GF2::MOGrevlex<136UL>_> *poly2)

{
  size_t *psVar1;
  size_t pos_1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  size_t pos_2;
  long lVar4;
  _List_node_base *p_Var5;
  MM<136UL> lm;
  _List_node_base *local_58 [4];
  _List_node_base *local_38 [3];
  
  local_38[0] = (_List_node_base *)0x0;
  local_38[1] = (_List_node_base *)0x0;
  local_38[2] = (_List_node_base *)0x0;
  std::__cxx11::list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>::clear
            (&this->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>);
  p_Var2 = (poly1->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
           super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  p_Var3 = (poly2->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
           super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  lVar4 = 2;
  do {
    local_58[lVar4 + 2] =
         (_List_node_base *)
         (*(ulong *)((long)&p_Var3->_M_next + lVar4 * 8) |
         *(ulong *)((long)&p_Var2->_M_next + lVar4 * 8));
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  lVar4 = 0;
  do {
    local_38[lVar4] =
         (_List_node_base *)((ulong)local_38[lVar4] & ~*(ulong *)((long)(p_Var2 + 1) + lVar4 * 8U));
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  p_Var5 = p_Var2->_M_next;
  if (p_Var5 != (_List_node_base *)poly1) {
    do {
      local_58[2] = (((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)&p_Var5[2]._M_next)
                    ->super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>)._M_impl.
                    _M_node.super__List_node_base._M_next;
      local_58[0] = *(_List_node_base **)
                     &((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)(p_Var5 + 1))->
                      super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>;
      local_58[1] = *(_List_node_base **)((long)(p_Var5 + 1) + 8);
      lVar4 = 0;
      do {
        local_58[lVar4] = (_List_node_base *)((ulong)local_58[lVar4] | (ulong)local_38[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      p_Var2 = (_List_node_base *)operator_new(0x28);
      p_Var2[1]._M_next = local_58[0];
      p_Var2[1]._M_prev = local_58[1];
      p_Var2[2]._M_next = local_58[2];
      std::__detail::_List_node_base::_M_hook(p_Var2);
      psVar1 = &(this->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
                super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 + 1;
      p_Var5 = (((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)&p_Var5->_M_next)->
               super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>)._M_impl._M_node.
               super__List_node_base._M_next;
    } while (p_Var5 != (_List_node_base *)poly1);
    p_Var3 = (poly2->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
             super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
             super__List_node_base._M_next;
    p_Var2 = (poly1->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
             super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
             super__List_node_base._M_next;
  }
  lVar4 = 2;
  do {
    local_58[lVar4 + 2] =
         (_List_node_base *)
         (*(ulong *)((long)&p_Var3->_M_next + lVar4 * 8) |
         *(ulong *)((long)&p_Var2->_M_next + lVar4 * 8));
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  lVar4 = 0;
  do {
    local_38[lVar4] =
         (_List_node_base *)((ulong)local_38[lVar4] & ~*(ulong *)((long)(p_Var3 + 1) + lVar4 * 8U));
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  for (p_Var2 = p_Var3->_M_next; p_Var2 != (_List_node_base *)poly2;
      p_Var2 = (((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)&p_Var2->_M_next)->
               super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>)._M_impl._M_node.
               super__List_node_base._M_next) {
    local_58[2] = (((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)&p_Var2[2]._M_next)->
                  super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>)._M_impl.
                  _M_node.super__List_node_base._M_next;
    local_58[0] = *(_List_node_base **)
                   &((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)(p_Var2 + 1))->
                    super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>;
    local_58[1] = *(_List_node_base **)((long)(p_Var2 + 1) + 8);
    lVar4 = 0;
    do {
      local_58[lVar4] = (_List_node_base *)((ulong)local_58[lVar4] | (ulong)local_38[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    p_Var3 = (_List_node_base *)operator_new(0x28);
    p_Var3[1]._M_next = local_58[0];
    p_Var3[1]._M_prev = local_58[1];
    p_Var3[2]._M_next = local_58[2];
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(this->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
              super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 + 1;
  }
  Normalize(this);
  return this;
}

Assistant:

MP& SPoly(const MP& poly1, const MP& poly2)
	{
		// предусловия
		assert(IsConsistent(poly1) && IsConsistent(poly2));
		assert(this != &poly1 && this != &poly2);
		// сбор мономов
		MM<_n> lm, m;
		const_iterator iter;
		SetEmpty();
		lm.LCM(poly1.LM(), poly2.LM()) /= poly1.LM();
		for (iter = poly1.begin(); ++iter != poly1.end();)
			push_back((m = *iter) *= lm);
		lm.LCM(poly1.LM(), poly2.LM()) /= poly2.LM();
		for (iter = poly2.begin(); ++iter != poly2.end();)
			push_back((m = *iter) *= lm);
		// нормализация
		Normalize();
		return *this;
	}